

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

void __thiscall wasm::FuncCastEmulation::run(FuncCastEmulation *this,Module *module)

{
  size_type *psVar1;
  int iVar2;
  ElementSegment *pEVar3;
  Expression *pEVar4;
  undefined4 *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int *piVar10;
  pointer ppEVar11;
  Function *pFVar12;
  undefined8 uVar13;
  ulong uVar14;
  pointer puVar15;
  ulong uVar16;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>,_bool>
  pVar17;
  Signature sig;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [3];
  bool local_1a8;
  Expression **local_1a0;
  size_t sStack_198;
  pointer local_f0;
  pointer pTStack_e8;
  pointer local_e0;
  Function *pFStack_d8;
  Module *local_d0;
  pointer local_c8;
  undefined4 local_c0;
  undefined1 local_b8 [8];
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  funcThunks;
  Type local_78;
  pointer local_70;
  _Alloc_hider local_68;
  HeapType ABIType;
  undefined8 local_58;
  Pass *local_48;
  Module *local_40;
  ulong local_38;
  
  psVar1 = &funcThunks._M_h._M_bucket_count;
  local_b8 = (undefined1  [8])psVar1;
  local_48 = &this->super_Pass;
  local_40 = module;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"max-func-params","");
  local_68._M_p = (pointer)&stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff98,"16","");
  Pass::getArgumentOrDefault
            ((string *)local_1f8,local_48,(string *)local_b8,(string *)&stack0xffffffffffffff98);
  uVar13 = local_1f8._0_8_;
  piVar10 = __errno_location();
  iVar2 = *piVar10;
  *piVar10 = 0;
  local_38 = strtoul((char *)uVar13,(char **)&funcThunks._M_h._M_single_bucket,10);
  if (funcThunks._M_h._M_single_bucket == (__node_base_ptr)uVar13) {
    uVar13 = std::__throw_invalid_argument("stoul");
    WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
    ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                   *)local_1f8);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_b8);
    _Unwind_Resume(uVar13);
  }
  if (*piVar10 == 0) {
    *piVar10 = iVar2;
  }
  else if (*piVar10 == 0x22) {
    std::__throw_out_of_range("stoul");
  }
  if ((__node_base_ptr)local_1f8._0_8_ != (__node_base_ptr)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  if (local_68._M_p != (pointer)&stack0xffffffffffffffa8) {
    operator_delete(local_68._M_p,local_58 + 1);
  }
  if (local_b8 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_b8,funcThunks._M_h._M_bucket_count + 1);
  }
  local_b8 = (undefined1  [8])0x3;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_1f8,local_38 & 0xffffffff,
             (value_type *)local_b8,(allocator_type *)&funcThunks._M_h._M_single_bucket);
  wasm::Type::Type(&local_78,(Tuple *)local_1f8);
  sig.results.id = 3;
  sig.params.id = local_78.id;
  HeapType::HeapType((HeapType *)&stack0xffffffffffffff98,sig);
  if ((__node_base_ptr)local_1f8._0_8_ != (__node_base_ptr)0x0) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ - local_1f8._0_8_);
  }
  local_b8 = (undefined1  [8])&funcThunks._M_h._M_rehash_policy._M_next_resize;
  funcThunks._M_h._M_buckets = (__buckets_ptr)0x1;
  funcThunks._M_h._M_bucket_count = 0;
  funcThunks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcThunks._M_h._M_element_count._0_4_ = 0x3f800000;
  funcThunks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  funcThunks._M_h._M_rehash_policy._4_4_ = 0;
  funcThunks._M_h._M_rehash_policy._M_next_resize = 0;
  puVar15 = (local_40->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_40->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != local_70) {
    do {
      bVar9 = wasm::Type::isFunction
                        (&((puVar15->_M_t).
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type
                        );
      if (bVar9) {
        pEVar3 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar11 = *(pointer *)
                    &(pEVar3->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl;
        if (*(pointer *)
             ((long)&(pEVar3->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> + 8
             ) != ppEVar11) {
          uVar14 = 0;
          uVar16 = 1;
          do {
            pEVar4 = ppEVar11[uVar14];
            if (pEVar4->_id == RefFuncId) {
              local_1f8._0_8_ = *(undefined8 *)(pEVar4 + 1);
              local_1f8._8_8_ = pEVar4[1].type.id;
              local_1f8._16_8_ = 0;
              pVar17 = std::
                       _Hashtable<wasm::Name,std::pair<wasm::Name_const,wasm::Function*>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       ::_M_emplace<std::pair<wasm::Name_const,wasm::Function*>>
                                 ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,wasm::Function*>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                   *)local_b8,local_1f8);
              if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pFVar12 = makeThunk((FuncCastEmulation *)local_48,
                                    (IString)*(IString *)&pEVar4[1]._id,local_40,(Index)local_38);
                *(Function **)
                 ((long)pVar17.first.
                        super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                 + 0x18) = pFVar12;
              }
              puVar5 = *(undefined4 **)
                        ((long)pVar17.first.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                        + 0x18);
              uVar6 = puVar5[1];
              uVar7 = puVar5[2];
              uVar8 = puVar5[3];
              *(undefined4 *)(pEVar4 + 1) = *puVar5;
              *(undefined4 *)&pEVar4[1].field_0x4 = uVar6;
              *(undefined4 *)&pEVar4[1].type.id = uVar7;
              *(undefined4 *)((long)&pEVar4[1].type.id + 4) = uVar8;
              uVar14 = *(ulong *)(puVar5 + 0xe);
              if (((uint)(0x7c < uVar14) * 4 + 3 & (uint)uVar14) != 0) {
                __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                              ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
              }
              (pEVar4->type).id = uVar14;
            }
            pEVar3 = (puVar15->_M_t).
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            ppEVar11 = *(pointer *)
                        &(pEVar3->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl;
            bVar9 = uVar16 < (ulong)((long)*(pointer *)
                                            ((long)&(pEVar3->data).
                                                                                                        
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            + 8) - (long)ppEVar11 >> 3);
            uVar14 = uVar16;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar9);
        }
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != local_70);
  }
  local_1f8._16_8_ = local_1d8;
  local_1f8._8_8_ = (PassRunner *)0x0;
  local_1f8._24_8_ = 0;
  local_1d8[0]._M_local_buf[0] = '\0';
  local_1a8 = false;
  local_1a0 = (Expression **)0x0;
  sStack_198 = 0;
  local_f0 = (pointer)0x0;
  pTStack_e8 = (pointer)0x0;
  local_e0 = (pointer)0x0;
  pFStack_d8 = (Function *)0x0;
  local_d0 = (Module *)0x0;
  local_1f8._0_8_ = &PTR__WalkerPass_01092380;
  local_c8 = local_68._M_p;
  local_c0 = (undefined4)local_38;
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
         *)local_1f8,local_48->runner,local_40);
  if (local_f0 != (pointer)0x0) {
    operator_delete(local_f0,(long)local_e0 - (long)local_f0);
  }
  Pass::~Pass((Pass *)local_1f8);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_b8);
  return;
}

Assistant:

void run(Module* module) override {
    Index numParams = std::stoul(getArgumentOrDefault("max-func-params", "16"));
    // we just need the one ABI function type for all indirect calls
    HeapType ABIType(
      Signature(Type(std::vector<Type>(numParams, Type::i64)), Type::i64));
    // Add a thunk for each function in the table, and do the call through it.
    std::unordered_map<Name, Function*> funcThunks;
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); ++i) {
        auto* ref = segment->data[i]->dynCast<RefFunc>();
        if (!ref) {
          continue;
        }
        auto [iter, inserted] = funcThunks.insert({ref->func, nullptr});
        if (inserted) {
          iter->second = makeThunk(ref->func, module, numParams);
        }
        auto* thunk = iter->second;
        ref->func = thunk->name;
        // TODO: Make this exact.
        ref->type = Type(thunk->type, NonNullable);
      }
    }

    // update call_indirects
    ParallelFuncCastEmulation(ABIType, numParams).run(getPassRunner(), module);
  }